

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O1

MppPktSeg * mpp_packet_get_segment_info(MppPacket packet)

{
  MPP_RET MVar1;
  MppPktSeg *pMVar2;
  
  MVar1 = check_is_mpp_packet_f(packet,"mpp_packet_get_segment_info");
  if ((MVar1 == MPP_OK) && (*(int *)((long)packet + 0x58) != 0)) {
    pMVar2 = *(MppPktSeg **)((long)packet + 0x128);
  }
  else {
    pMVar2 = (MppPktSeg *)0x0;
  }
  return pMVar2;
}

Assistant:

const MppPktSeg *mpp_packet_get_segment_info(const MppPacket packet)
{
    if (check_is_mpp_packet(packet))
        return NULL;

    MppPacketImpl *p = (MppPacketImpl *)packet;

    if (!p->segment_nb)
        return NULL;

    return (const MppPktSeg *)p->segments;
}